

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_predictor_16x4_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  long lVar10;
  uint16_t *puVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  lVar10 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  iVar17 = 0;
  do {
    uVar1 = *(ulong *)(above + lVar10);
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)(uVar1 >> 0x30);
    auVar4._8_2_ = (short)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._10_4_ = auVar2._10_4_;
    auVar8._6_8_ = 0;
    auVar8._0_6_ = auVar4._8_6_;
    auVar6._4_2_ = (short)(uVar1 >> 0x10);
    auVar6._0_4_ = (uint)uVar1;
    auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
    iVar14 = iVar14 + ((uint)uVar1 & 0xffff);
    iVar15 = iVar15 + auVar6._4_4_;
    iVar16 = iVar16 + auVar4._8_4_;
    iVar17 = iVar17 + (auVar2._10_4_ >> 0x10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  uVar1 = *(ulong *)left;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3._12_2_ = (short)(uVar1 >> 0x30);
  auVar5._8_2_ = (short)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._10_4_ = auVar3._10_4_;
  auVar9._6_8_ = 0;
  auVar9._0_6_ = auVar5._8_6_;
  auVar7._4_2_ = (short)(uVar1 >> 0x10);
  auVar7._0_4_ = (uint)uVar1;
  auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
  auVar13 = ZEXT416(((auVar3._10_4_ >> 0x10) + auVar7._4_4_ +
                     auVar5._8_4_ + iVar17 + iVar15 + iVar16 + iVar14 + ((uint)uVar1 & 0xffff) + 10
                    >> 2) * 0x6667 >> 0x11);
  auVar13 = pshuflw(auVar13,auVar13,0);
  uVar12 = auVar13._0_4_;
  puVar11 = dst + 8;
  iVar14 = 4;
  do {
    *(undefined4 *)(puVar11 + -8) = uVar12;
    *(undefined4 *)(puVar11 + -6) = uVar12;
    *(undefined4 *)(puVar11 + -4) = uVar12;
    *(undefined4 *)(puVar11 + -2) = uVar12;
    *(undefined4 *)puVar11 = uVar12;
    *(undefined4 *)(puVar11 + 2) = uVar12;
    *(undefined4 *)(puVar11 + 4) = uVar12;
    *(undefined4 *)(puVar11 + 6) = uVar12;
    puVar11 = puVar11 + stride;
    iVar14 = iVar14 + -1;
  } while (iVar14 != 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x4_c(uint16_t *dst, ptrdiff_t stride,
                                    const uint16_t *above, const uint16_t *left,
                                    int bd) {
  highbd_dc_predictor_rect(dst, stride, 16, 4, above, left, bd, 2,
                           HIGHBD_DC_MULTIPLIER_1X4);
}